

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O3

ggml_tensor * __thiscall
llama_adapter_cvec::apply_to(llama_adapter_cvec *this,ggml_context *ctx,ggml_tensor *cur,int il)

{
  pointer ppgVar1;
  ggml_tensor *pgVar2;
  
  if (((-1 < il) && (this->layer_start <= il)) && (il <= this->layer_end)) {
    ppgVar1 = (this->tensors).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((ulong)(uint)il <
         (ulong)((long)(this->tensors).
                       super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppgVar1 >> 3)) &&
       (pgVar2 = ppgVar1[(uint)il], pgVar2 != (ggml_tensor *)0x0)) {
      pgVar2 = (ggml_tensor *)ggml_add(ctx,cur,pgVar2);
      return pgVar2;
    }
  }
  return cur;
}

Assistant:

ggml_tensor * llama_adapter_cvec::tensor_for(int il) const {
    if (il < 0 || il < layer_start || il > layer_end || (size_t) il >= tensors.size()) {
        return nullptr;
    }

    return tensors[il];
}